

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadLinkingSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  uint uVar3;
  ComdatType comdat_type;
  uint local_1f0;
  uint local_1ec;
  uint32_t index_2;
  uint32_t kind_1;
  size_t local_1e0;
  Enum local_1d8;
  Enum local_1d4;
  Enum local_1d0;
  Enum local_1cc;
  undefined1 local_1c8 [8];
  string_view name_2;
  uint local_1b0;
  uint32_t entry_count;
  uint32_t flags_2;
  Enum local_1a4;
  Enum local_1a0;
  Enum local_19c;
  uint local_198;
  uint local_194;
  uint32_t func;
  uint32_t priority;
  Address local_188;
  size_t local_180;
  Enum local_174;
  Enum local_170;
  Enum local_16c;
  Enum local_168;
  uint local_164;
  Address AStack_160;
  uint32_t flags_1;
  Address alignment_log2;
  string_view name_1;
  Index i_1;
  uint32_t local_134;
  size_t sStack_130;
  uint32_t index_1;
  size_t local_128;
  Enum local_120;
  Enum local_11c;
  Enum local_118;
  Enum local_114;
  Enum local_110;
  uint32_t local_10c;
  uint32_t local_108;
  uint32_t size;
  uint32_t offset;
  uint32_t segment;
  size_t local_f8;
  Enum local_ec;
  size_t local_e8;
  size_t local_e0;
  Enum local_d4;
  size_t local_d0;
  size_t local_c8;
  Enum local_bc;
  size_t local_b8;
  size_t local_b0;
  Enum local_a4;
  Enum local_a0;
  Enum local_9c;
  uint32_t local_98;
  uint32_t local_94;
  uint32_t index;
  SymbolType sym_type;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t kind;
  uint32_t flags;
  string_view name;
  Index i;
  uint local_5c;
  undefined1 local_58 [4];
  uint32_t count;
  ReadEndRestoreGuard guard;
  size_t subsection_end;
  Offset local_38;
  Offset subsection_size;
  uint32_t linking_type;
  Enum local_24;
  uint32_t version;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _version = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc3])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (bVar1) {
    subsection_size._4_4_ = ReadU32Leb128(this,&linking_type,"version");
    bVar1 = Failed(subsection_size._4_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else if (linking_type == 2) {
      do {
        if (this->read_end_ <= (this->state_).offset) {
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd2])();
          bVar1 = Succeeded(RVar2);
          if (!bVar1) {
            PrintError(this,"EndLinkingSection callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          Result::Result((Result *)((long)&this_local + 4),Ok);
          return (Result)this_local._4_4_;
        }
        RVar2 = ReadU32Leb128(this,(uint32_t *)&subsection_size,"type");
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        RVar2 = ReadOffset(this,&local_38,"subsection size");
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        guard.previous_value_ = (this->state_).offset + local_38;
        if (this->read_end_ < guard.previous_value_) {
          PrintError(this,"invalid sub-section size: extends past end");
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
        ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                           *)local_58,this);
        this->read_end_ = guard.previous_value_;
        switch((undefined4)subsection_size) {
        case 5:
          RVar2 = ReadU32Leb128(this,&local_5c,"info count");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            name_1._M_str._4_4_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcb])();
            bVar1 = Succeeded(name_1._M_str._4_4_);
            if (bVar1) {
              for (name_1._M_str._0_4_ = 0; (uint)name_1._M_str < local_5c;
                  name_1._M_str._0_4_ = (uint)name_1._M_str + 1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)&alignment_log2);
                local_168 = (Enum)ReadStr(this,(string_view *)&alignment_log2,"segment name");
                bVar1 = Failed((Result)local_168);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
                local_16c = (Enum)ReadAlignment(this,&stack0xfffffffffffffea0,"segment alignment");
                bVar1 = Failed((Result)local_16c);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
                local_170 = (Enum)ReadU32Leb128(this,&local_164,"segment flags");
                bVar1 = Failed((Result)local_170);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
                local_188 = alignment_log2;
                local_180 = name_1._M_len;
                local_174 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcc])
                                      (this->delegate_,(ulong)(uint)name_1._M_str,alignment_log2,
                                       name_1._M_len,AStack_160,(ulong)local_164);
                bVar1 = Succeeded((Result)local_174);
                if (!bVar1) {
                  PrintError(this,"OnSegmentInfo callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
              }
              goto LAB_001e3ce5;
            }
            PrintError(this,"OnSegmentInfoCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          break;
        case 6:
          priority = (uint32_t)ReadU32Leb128(this,&local_5c,"info count");
          bVar1 = Failed((Result)priority);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            func = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcd])();
            bVar1 = Succeeded((Result)func);
            if (bVar1) {
              do {
                uVar3 = local_5c - 1;
                bVar1 = local_5c == 0;
                local_5c = uVar3;
                if (bVar1) goto LAB_001e3ce5;
                local_19c = (Enum)ReadU32Leb128(this,&local_194,"priority");
                bVar1 = Failed((Result)local_19c);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
                local_1a0 = (Enum)ReadU32Leb128(this,&local_198,"function index");
                bVar1 = Failed((Result)local_1a0);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
                local_1a4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xce])
                                      (this->delegate_,(ulong)local_194,(ulong)local_198);
                bVar1 = Succeeded((Result)local_1a4);
              } while (bVar1);
              PrintError(this,"OnInitFunction callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              PrintError(this,"OnInitFunctionCount callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
          }
          break;
        case 7:
          flags_2 = (uint32_t)ReadU32Leb128(this,&local_5c,"count");
          bVar1 = Failed((Result)flags_2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            entry_count = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcf])();
            bVar1 = Succeeded((Result)entry_count);
            if (bVar1) {
              while (uVar3 = local_5c - 1, bVar1 = local_5c != 0, local_5c = uVar3, bVar1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8);
                local_1cc = (Enum)ReadStr(this,(string_view *)local_1c8,"comdat name");
                bVar1 = Failed((Result)local_1cc);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
                local_1d0 = (Enum)ReadU32Leb128(this,&local_1b0,"flags");
                bVar1 = Failed((Result)local_1d0);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
                local_1d4 = (Enum)ReadU32Leb128(this,(uint32_t *)((long)&name_2._M_str + 4),
                                                "entry count");
                bVar1 = Failed((Result)local_1d4);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
                _index_2 = (size_t)local_1c8;
                local_1e0 = name_2._M_len;
                local_1d8 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd0])
                                      (this->delegate_,local_1c8,name_2._M_len,(ulong)local_1b0,
                                       (ulong)name_2._M_str._4_4_);
                bVar1 = Succeeded((Result)local_1d8);
                if (!bVar1) {
                  PrintError(this,"OnComdatBegin callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
                while (uVar3 = name_2._M_str._4_4_ - 1, bVar1 = name_2._M_str._4_4_ != 0,
                      name_2._M_str._4_4_ = uVar3, bVar1) {
                  RVar2 = ReadU32Leb128(this,&local_1ec,"kind");
                  bVar1 = Failed(RVar2);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_001e3d33;
                  }
                  RVar2 = ReadU32Leb128(this,&local_1f0,"index");
                  bVar1 = Failed(RVar2);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_001e3d33;
                  }
                  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd1])
                                          (this->delegate_,(ulong)local_1ec,(ulong)local_1f0);
                  bVar1 = Succeeded(RVar2);
                  if (!bVar1) {
                    PrintError(this,"OnComdatEntry callback failed");
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_001e3d33;
                  }
                }
              }
              goto LAB_001e3ce5;
            }
            PrintError(this,"OnComdatCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          break;
        case 8:
          RVar2 = ReadU32Leb128(this,&local_5c,"sym count");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc4])();
            bVar1 = Succeeded(RVar2);
            if (bVar1) {
              for (name._M_str._4_4_ = 0; name._M_str._4_4_ < local_5c;
                  name._M_str._4_4_ = name._M_str._4_4_ + 1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)&kind);
                local_84 = 0;
                local_88 = 0;
                sym_type = (SymbolType)ReadU32Leb128(this,&local_88,"sym type");
                bVar1 = Failed((Result)sym_type);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
                index = (uint32_t)ReadU32Leb128(this,&local_84,"sym flags");
                bVar1 = Failed((Result)index);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_001e3d33;
                }
                local_94 = local_88;
                if (local_88 == 0) {
LAB_001e2eb6:
                  local_98 = 0;
                  local_9c = (Enum)ReadU32Leb128(this,&local_98,"index");
                  bVar1 = Failed((Result)local_9c);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_001e3d33;
                  }
                  if (((local_84 & 0x10) == 0) || ((local_84 & 0x40) != 0)) {
                    local_a0 = (Enum)ReadStr(this,(string_view *)&kind,"symbol name");
                    bVar1 = Failed((Result)local_a0);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_001e3d33;
                    }
                  }
                  switch(local_94) {
                  case 0:
                    local_b8 = _kind;
                    local_b0 = name._M_len;
                    local_a4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc6])
                                         (this->delegate_,(ulong)name._M_str._4_4_,(ulong)local_84,
                                          _kind,name._M_len,(ulong)local_98);
                    bVar1 = Succeeded((Result)local_a4);
                    if (!bVar1) {
                      PrintError(this,"OnFunctionSymbol callback failed");
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_001e3d33;
                    }
                    break;
                  default:
                    abort();
                  case 2:
                    local_d0 = _kind;
                    local_c8 = name._M_len;
                    local_bc = (*this->delegate_->_vptr_BinaryReaderDelegate[199])
                                         (this->delegate_,(ulong)name._M_str._4_4_,(ulong)local_84,
                                          _kind,name._M_len,(ulong)local_98);
                    bVar1 = Succeeded((Result)local_bc);
                    if (!bVar1) {
                      PrintError(this,"OnGlobalSymbol callback failed");
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_001e3d33;
                    }
                    break;
                  case 4:
                    local_e8 = _kind;
                    local_e0 = name._M_len;
                    local_d4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc9])
                                         (this->delegate_,(ulong)name._M_str._4_4_,(ulong)local_84,
                                          _kind,name._M_len,(ulong)local_98);
                    bVar1 = Succeeded((Result)local_d4);
                    if (!bVar1) {
                      PrintError(this,"OnTagSymbol callback failed");
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_001e3d33;
                    }
                    break;
                  case 5:
                    _offset = _kind;
                    local_f8 = name._M_len;
                    local_ec = (*this->delegate_->_vptr_BinaryReaderDelegate[0xca])
                                         (this->delegate_,(ulong)name._M_str._4_4_,(ulong)local_84,
                                          _kind,name._M_len,(ulong)local_98);
                    bVar1 = Succeeded((Result)local_ec);
                    if (!bVar1) {
                      PrintError(this,"OnTableSymbol callback failed");
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_001e3d33;
                    }
                  }
                }
                else if (local_88 == 1) {
                  size = 0;
                  local_108 = 0;
                  local_10c = 0;
                  local_110 = (Enum)ReadStr(this,(string_view *)&kind,"symbol name");
                  bVar1 = Failed((Result)local_110);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_001e3d33;
                  }
                  if ((local_84 & 0x10) == 0) {
                    local_114 = (Enum)ReadU32Leb128(this,&size,"segment");
                    bVar1 = Failed((Result)local_114);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_001e3d33;
                    }
                    local_118 = (Enum)ReadU32Leb128(this,&local_108,"offset");
                    bVar1 = Failed((Result)local_118);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_001e3d33;
                    }
                    local_11c = (Enum)ReadU32Leb128(this,&local_10c,"size");
                    bVar1 = Failed((Result)local_11c);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_001e3d33;
                    }
                  }
                  sStack_130 = _kind;
                  local_128 = name._M_len;
                  local_120 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc5])
                                        (this->delegate_,(ulong)name._M_str._4_4_,(ulong)local_84,
                                         _kind,name._M_len,(ulong)size,local_108,local_10c);
                  bVar1 = Succeeded((Result)local_120);
                  if (!bVar1) {
                    PrintError(this,"OnDataSymbol callback failed");
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_001e3d33;
                  }
                }
                else {
                  if (local_88 == 2) goto LAB_001e2eb6;
                  if (local_88 == 3) {
                    local_134 = 0;
                    RVar2 = ReadU32Leb128(this,&local_134,"index");
                    bVar1 = Failed(RVar2);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_001e3d33;
                    }
                    RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[200])
                                            (this->delegate_,(ulong)name._M_str._4_4_,
                                             (ulong)local_84,(ulong)local_134);
                    bVar1 = Succeeded(RVar2);
                    if (!bVar1) {
                      PrintError(this,"OnSectionSymbol callback failed");
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_001e3d33;
                    }
                  }
                  else if (local_88 == 4 || local_88 == 5) goto LAB_001e2eb6;
                }
              }
              goto LAB_001e3ce5;
            }
            PrintError(this,"OnSymbolCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          break;
        default:
          (this->state_).offset = guard.previous_value_;
LAB_001e3ce5:
          if ((this->state_).offset == guard.previous_value_) {
            bVar1 = false;
          }
          else {
            PrintError(this,"unfinished sub-section (expected end: 0x%zx)",guard.previous_value_);
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
        }
LAB_001e3d33:
        ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
        ~ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                            *)local_58);
      } while (!bVar1);
    }
    else {
      PrintError(this,"invalid linking metadata version: %u",(ulong)linking_type);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    PrintError(this,"BeginLinkingSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadLinkingSection(Offset section_size) {
  CALLBACK(BeginLinkingSection, section_size);
  uint32_t version;
  CHECK_RESULT(ReadU32Leb128(&version, "version"));
  ERROR_UNLESS(version == 2, "invalid linking metadata version: %u", version);
  while (state_.offset < read_end_) {
    uint32_t linking_type;
    Offset subsection_size;
    CHECK_RESULT(ReadU32Leb128(&linking_type, "type"));
    CHECK_RESULT(ReadOffset(&subsection_size, "subsection size"));
    size_t subsection_end = state_.offset + subsection_size;
    ERROR_UNLESS(subsection_end <= read_end_,
                 "invalid sub-section size: extends past end");
    ReadEndRestoreGuard guard(this);
    read_end_ = subsection_end;

    uint32_t count;
    switch (static_cast<LinkingEntryType>(linking_type)) {
      case LinkingEntryType::SymbolTable:
        CHECK_RESULT(ReadU32Leb128(&count, "sym count"));
        CALLBACK(OnSymbolCount, count);
        for (Index i = 0; i < count; ++i) {
          std::string_view name;
          uint32_t flags = 0;
          uint32_t kind = 0;
          CHECK_RESULT(ReadU32Leb128(&kind, "sym type"));
          CHECK_RESULT(ReadU32Leb128(&flags, "sym flags"));
          SymbolType sym_type = static_cast<SymbolType>(kind);
          switch (sym_type) {
            case SymbolType::Function:
            case SymbolType::Global:
            case SymbolType::Tag:
            case SymbolType::Table: {
              uint32_t index = 0;
              CHECK_RESULT(ReadU32Leb128(&index, "index"));
              if ((flags & WABT_SYMBOL_FLAG_UNDEFINED) == 0 ||
                  (flags & WABT_SYMBOL_FLAG_EXPLICIT_NAME) != 0)
                CHECK_RESULT(ReadStr(&name, "symbol name"));
              switch (sym_type) {
                case SymbolType::Function:
                  CALLBACK(OnFunctionSymbol, i, flags, name, index);
                  break;
                case SymbolType::Global:
                  CALLBACK(OnGlobalSymbol, i, flags, name, index);
                  break;
                case SymbolType::Tag:
                  CALLBACK(OnTagSymbol, i, flags, name, index);
                  break;
                case SymbolType::Table:
                  CALLBACK(OnTableSymbol, i, flags, name, index);
                  break;
                default:
                  WABT_UNREACHABLE;
              }
              break;
            }
            case SymbolType::Data: {
              uint32_t segment = 0;
              uint32_t offset = 0;
              uint32_t size = 0;
              CHECK_RESULT(ReadStr(&name, "symbol name"));
              if ((flags & WABT_SYMBOL_FLAG_UNDEFINED) == 0) {
                CHECK_RESULT(ReadU32Leb128(&segment, "segment"));
                CHECK_RESULT(ReadU32Leb128(&offset, "offset"));
                CHECK_RESULT(ReadU32Leb128(&size, "size"));
              }
              CALLBACK(OnDataSymbol, i, flags, name, segment, offset, size);
              break;
            }
            case SymbolType::Section: {
              uint32_t index = 0;
              CHECK_RESULT(ReadU32Leb128(&index, "index"));
              CALLBACK(OnSectionSymbol, i, flags, index);
              break;
            }
          }
        }
        break;
      case LinkingEntryType::SegmentInfo:
        CHECK_RESULT(ReadU32Leb128(&count, "info count"));
        CALLBACK(OnSegmentInfoCount, count);
        for (Index i = 0; i < count; i++) {
          std::string_view name;
          Address alignment_log2;
          uint32_t flags;
          CHECK_RESULT(ReadStr(&name, "segment name"));
          CHECK_RESULT(ReadAlignment(&alignment_log2, "segment alignment"));
          CHECK_RESULT(ReadU32Leb128(&flags, "segment flags"));
          CALLBACK(OnSegmentInfo, i, name, alignment_log2, flags);
        }
        break;
      case LinkingEntryType::InitFunctions:
        CHECK_RESULT(ReadU32Leb128(&count, "info count"));
        CALLBACK(OnInitFunctionCount, count);
        while (count--) {
          uint32_t priority;
          uint32_t func;
          CHECK_RESULT(ReadU32Leb128(&priority, "priority"));
          CHECK_RESULT(ReadU32Leb128(&func, "function index"));
          CALLBACK(OnInitFunction, priority, func);
        }
        break;
      case LinkingEntryType::ComdatInfo:
        CHECK_RESULT(ReadU32Leb128(&count, "count"));
        CALLBACK(OnComdatCount, count);
        while (count--) {
          uint32_t flags;
          uint32_t entry_count;
          std::string_view name;
          CHECK_RESULT(ReadStr(&name, "comdat name"));
          CHECK_RESULT(ReadU32Leb128(&flags, "flags"));
          CHECK_RESULT(ReadU32Leb128(&entry_count, "entry count"));
          CALLBACK(OnComdatBegin, name, flags, entry_count);
          while (entry_count--) {
            uint32_t kind;
            uint32_t index;
            CHECK_RESULT(ReadU32Leb128(&kind, "kind"));
            CHECK_RESULT(ReadU32Leb128(&index, "index"));
            ComdatType comdat_type = static_cast<ComdatType>(kind);
            CALLBACK(OnComdatEntry, comdat_type, index);
          }
        }
        break;
      default:
        // Unknown subsection, skip it.
        state_.offset = subsection_end;
        break;
    }
    ERROR_UNLESS(state_.offset == subsection_end,
                 "unfinished sub-section (expected end: 0x%" PRIzx ")",
                 subsection_end);
  }
  CALLBACK0(EndLinkingSection);
  return Result::Ok;
}